

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::EndPhase(Func *this,Phase tag,bool dump)

{
  undefined8 uVar1;
  code *pcVar2;
  bool bVar3;
  ExecutionMode EVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  undefined4 *puVar8;
  DbCheckPostLower local_28;
  DbCheckPostLower dbCheck_1;
  DbCheckPostLower dbCheck;
  bool dump_local;
  Phase tag_local;
  Func *this_local;
  
  EndProfiler(this,tag);
  if (dump) {
    uVar5 = GetSourceContextId(this);
    uVar6 = GetLocalFunctionId(this);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,tag,uVar5,uVar6);
    if (!bVar3) {
      uVar5 = GetSourceContextId(this);
      uVar6 = GetLocalFunctionId(this);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,BackEndPhase,uVar5,uVar6);
      if (!bVar3) goto LAB_00554064;
    }
    Output::Print(L"-----------------------------------------------------------------------------\n"
                 );
    bVar3 = IsLoopBody(this);
    if (bVar3) {
      uVar1 = *(undefined8 *)(Js::PhaseNames + (ulong)tag * 8);
      EVar4 = JITTimeWorkItem::GetJitMode(this->m_workItem);
      pcVar7 = ExecutionModeName(EVar4);
      uVar5 = JITTimeWorkItem::GetLoopNumber(this->m_workItem);
      Output::Print(L"************   IR after %s (%S) Loop %d ************\n",uVar1,pcVar7,
                    (ulong)uVar5);
    }
    else {
      uVar1 = *(undefined8 *)(Js::PhaseNames + (ulong)tag * 8);
      EVar4 = JITTimeWorkItem::GetJitMode(this->m_workItem);
      pcVar7 = ExecutionModeName(EVar4);
      Output::Print(L"************   IR after %s (%S)  ************\n",uVar1,pcVar7);
    }
    Dump(this,(uint)((DAT_01e9e22f & 1) != 0));
  }
LAB_00554064:
  if (tag == RegAllocPhase) {
    *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 & 0xfff7ffff | 0x80000;
  }
  if (tag == LowererPhase) {
    if ((*(uint *)&this->field_0x240 >> 0x15 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x534,"(!this->isPostLower)","!this->isPostLower");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 & 0xffdfffff | 0x200000;
    DbCheckPostLower::DbCheckPostLower(&dbCheck_1,this);
    DbCheckPostLower::CheckNestedHelperCalls(&dbCheck_1);
  }
  else if (tag == RegAllocPhase) {
    if ((*(uint *)&this->field_0x240 >> 0x16 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x53d,"(!this->isPostRegAlloc)","!this->isPostRegAlloc");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 & 0xffbfffff | 0x400000;
  }
  else if (tag == PeepsPhase) {
    if (((*(uint *)&this->field_0x240 >> 0x15 & 1) == 0) ||
       ((*(uint *)&this->field_0x240 >> 0x18 & 1) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x542,"(this->isPostLower && !this->isPostLayout)",
                         "this->isPostLower && !this->isPostLayout");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 & 0xff7fffff | 0x800000;
  }
  else if (tag == LayoutPhase) {
    if (((*(uint *)&this->field_0x240 >> 0x17 & 1) == 0) ||
       ((*(uint *)&this->field_0x240 >> 0x18 & 1) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x547,"(this->isPostPeeps && !this->isPostLayout)",
                         "this->isPostPeeps && !this->isPostLayout");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 & 0xfeffffff | 0x1000000;
  }
  else if (tag == FinalLowerPhase) {
    if (((*(uint *)&this->field_0x240 >> 0x18 & 1) == 0) ||
       ((*(uint *)&this->field_0x240 >> 0x19 & 1) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x54c,"(this->isPostLayout && !this->isPostFinalLower)",
                         "this->isPostLayout && !this->isPostFinalLower");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 & 0xfdffffff | 0x2000000;
  }
  if ((*(uint *)&this->field_0x240 >> 0x15 & 1) != 0) {
    DbCheckPostLower::DbCheckPostLower(&local_28,this);
    DbCheckPostLower::Check(&local_28);
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::MergeDelayFreeList
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this->m_alloc);
  return;
}

Assistant:

void
Func::EndPhase(Js::Phase tag, bool dump)
{
    this->EndProfiler(tag);
#if DBG_DUMP
    if(dump && (PHASE_DUMP(tag, this)
        || PHASE_DUMP(Js::BackEndPhase, this)))
    {
        Output::Print(_u("-----------------------------------------------------------------------------\n"));

        if (IsLoopBody())
        {
            Output::Print(_u("************   IR after %s (%S) Loop %d ************\n"),
                Js::PhaseNames[tag],
                ExecutionModeName(m_workItem->GetJitMode()),
                m_workItem->GetLoopNumber());
        }
        else
        {
            Output::Print(_u("************   IR after %s (%S)  ************\n"),
                Js::PhaseNames[tag],
                ExecutionModeName(m_workItem->GetJitMode()));
        }
        this->Dump(Js::Configuration::Global.flags.AsmDiff? IRDumpFlags_AsmDumpMode : IRDumpFlags_None);
    }
#endif

    if (tag == Js::RegAllocPhase)
    {
        this->legalizePostRegAlloc = true;
    }

#if DBG
    if (tag == Js::LowererPhase)
    {
        Assert(!this->isPostLower);
        this->isPostLower = true;
#if !defined(_M_ARM) && !defined(_M_ARM64) // Need to verify ARM is clean.
        DbCheckPostLower dbCheck(this);
        dbCheck.CheckNestedHelperCalls();
#endif
    }
    else if (tag == Js::RegAllocPhase)
    {
        Assert(!this->isPostRegAlloc);
        this->isPostRegAlloc = true;
    }
    else if (tag == Js::PeepsPhase)
    {
        Assert(this->isPostLower && !this->isPostLayout);
        this->isPostPeeps = true;
    }
    else if (tag == Js::LayoutPhase)
    {
        Assert(this->isPostPeeps && !this->isPostLayout);
        this->isPostLayout = true;
    }
    else if (tag == Js::FinalLowerPhase)
    {
        Assert(this->isPostLayout && !this->isPostFinalLower);
        this->isPostFinalLower = true;
    }
    if (this->isPostLower)
    {
#ifndef _M_ARM    // Need to verify ARM is clean.
        DbCheckPostLower dbCheck(this);

        dbCheck.Check();
#endif
    }
    this->m_alloc->MergeDelayFreeList();
#endif
}